

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_polymorphism.h
# Opt level: O2

void density_tests::
     polymorphic_consume<density_tests::Derived1,density::lf_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>::reentrant_consume_operation>
               (reentrant_consume_operation *i_consume)

{
  int iVar1;
  runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  *prVar2;
  Derived1 *pDVar3;
  void *i_address;
  
  prVar2 = density::
           lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
           ::reentrant_consume_operation::complete_type(i_consume);
  if (prVar2->m_feature_table !=
      (tuple_type *)
      density::detail::
      FeatureTable<std::tuple<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density_tests::Derived1>
      ::s_table) {
    detail::assert_failed<>
              ("i_consume.complete_type().template is<EXPECTED_TYPE>()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/complex_polymorphism.h"
               ,0x93);
  }
  pDVar3 = density::
           lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
           ::reentrant_consume_operation::element<density_tests::Derived1>(i_consume);
  Derived1::check(pDVar3);
  pDVar3 = density::
           lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
           ::reentrant_consume_operation::element<density_tests::Derived1>(i_consume);
  iVar1 = (**pDVar3->_vptr_Derived1)(pDVar3);
  if (iVar1 != 0x14) {
    detail::assert_failed<>
              ("i_consume.template element<EXPECTED_TYPE>().class_id() == EXPECTED_TYPE::s_class_id"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/complex_polymorphism.h"
               ,0x9a);
  }
  i_address = density::
              lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
              ::reentrant_consume_operation::unaligned_element_ptr(i_consume);
  prVar2 = density::
           lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
           ::reentrant_consume_operation::complete_type(i_consume);
  pDVar3 = (Derived1 *)
           density::address_upper_align
                     (i_address,
                      (size_t)(prVar2->m_feature_table->
                              super__Tuple_impl<0UL,_density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                              ).
                              super__Tuple_impl<1UL,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                              .
                              super__Tuple_impl<2UL,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                              .
                              super__Tuple_impl<3UL,_density::f_destroy,_density::f_size,_density::f_alignment>
                              .super__Tuple_impl<4UL,_density::f_size,_density::f_alignment>.
                              super__Tuple_impl<5UL,_density::f_alignment>.
                              super__Head_base<5UL,_density::f_alignment,_false>);
  Derived1::check(pDVar3);
  iVar1 = (**pDVar3->_vptr_Derived1)(pDVar3);
  if (iVar1 != 0x14) {
    detail::assert_failed<>
              ("element_ptr->class_id() == EXPECTED_TYPE::s_class_id",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/complex_polymorphism.h"
               ,0xa1);
  }
  density::
  lf_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::reentrant_consume_operation::commit(i_consume);
  return;
}

Assistant:

void polymorphic_consume(CONSUME_OPERATION i_consume)
    {
        DENSITY_TEST_ASSERT(i_consume.complete_type().template is<EXPECTED_TYPE>());

        //i_consume.element_ptr()->check();
        i_consume.template element<EXPECTED_TYPE>().check();

        //DENSITY_TEST_ASSERT(i_consume.element_ptr()->class_id() == EXPECTED_TYPE::s_class_id);
        DENSITY_TEST_ASSERT(
          i_consume.template element<EXPECTED_TYPE>().class_id() == EXPECTED_TYPE::s_class_id);

        auto const unaligned_element_ptr = i_consume.unaligned_element_ptr();
        auto const untyped_element_ptr   = density::address_upper_align(
          unaligned_element_ptr, i_consume.complete_type().alignment());
        auto const element_ptr = static_cast<EXPECTED_TYPE *>(untyped_element_ptr);
        element_ptr->check();
        DENSITY_TEST_ASSERT(element_ptr->class_id() == EXPECTED_TYPE::s_class_id);

        i_consume.commit();
    }